

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

int __thiscall icu_63::RuleBasedNumberFormat::init(RuleBasedNumberFormat *this,EVP_PKEY_CTX *ctx)

{
  short sVar1;
  int iVar2;
  UnicodeString *pUVar3;
  ushort uVar4;
  UBool UVar5;
  int in_EAX;
  uint uVar6;
  int iVar7;
  int32_t iVar8;
  int extraout_EAX;
  NFRule *pNVar9;
  LocalizationInfo *pLVar10;
  UnicodeString *pUVar11;
  NFRuleSet **ppNVar12;
  long *plVar13;
  NFRuleSet *pNVar14;
  undefined4 extraout_var;
  ushort uVar15;
  undefined8 *in_RCX;
  char16_t *pcVar16;
  int32_t length;
  LocalizationInfo *in_RDX;
  long lVar17;
  UChar *pUVar18;
  size_t size;
  RuleBasedNumberFormat *this_00;
  UMemory *this_01;
  uint uVar19;
  UErrorCode *in_R8;
  uint uVar20;
  uint srcStart;
  long lVar21;
  ulong uVar22;
  UnicodeString description;
  UnicodeString name;
  ulong local_f0;
  UErrorCode local_e4;
  undefined1 local_e0 [10];
  char16_t local_d6 [27];
  UErrorCode *local_a0;
  LocalizationInfo *local_98;
  ConstChar16Ptr local_90;
  UnicodeString *local_88;
  char16_t *local_80;
  UnicodeString local_70;
  
  in_RCX[6] = 0;
  in_RCX[7] = 0;
  in_RCX[4] = 0;
  in_RCX[5] = 0;
  in_RCX[2] = 0;
  in_RCX[3] = 0;
  *in_RCX = 0;
  in_RCX[1] = 0;
  in_RCX[8] = 0;
  if (U_ZERO_ERROR < *in_R8) {
    return in_EAX;
  }
  initializeDecimalFormatSymbols(this,in_R8);
  initializeDefaultInfinityRule(this,in_R8);
  pNVar9 = initializeDefaultNaNRule(this,in_R8);
  if (U_ZERO_ERROR < *in_R8) {
    return (int)pNVar9;
  }
  if (in_RDX == (LocalizationInfo *)0x0) {
    pLVar10 = (LocalizationInfo *)0x0;
  }
  else {
    in_RDX->refcount = in_RDX->refcount + 1;
    pLVar10 = in_RDX;
  }
  this->localizations = pLVar10;
  this_00 = (RuleBasedNumberFormat *)local_e0;
  local_88 = (UnicodeString *)ctx;
  UnicodeString::UnicodeString((UnicodeString *)this_00,(UnicodeString *)ctx);
  uVar6 = local_d6._2_4_;
  if (-1 < (short)local_e0._8_2_) {
    uVar6 = (int)(short)local_e0._8_2_ >> 5;
  }
  local_e4 = U_MEMORY_ALLOCATION_ERROR;
  if (uVar6 != 0) {
    stripWhitespace(this_00,(UnicodeString *)local_e0);
    uVar6 = local_d6._2_4_;
    if (-1 < (short)local_e0._8_2_) {
      uVar6 = (int)(short)local_e0._8_2_ >> 5;
    }
    uVar19 = (int)uVar6 >> 0x1f & uVar6;
    local_98 = in_RDX;
    uVar6 = UnicodeString::indexOf
                      ((UnicodeString *)local_e0,L"%%lenient-parse:",0,-1,uVar19,uVar6 - uVar19);
    if (uVar6 != 0xffffffff) {
      if (uVar6 == 0) {
LAB_002152a4:
        if ((int)uVar6 < 0) {
          uVar19 = 0;
        }
        else {
          uVar19 = local_d6._2_4_;
          if (-1 < (short)local_e0._8_2_) {
            uVar19 = (int)(short)local_e0._8_2_ >> 5;
          }
          if ((int)uVar6 <= (int)uVar19) {
            uVar19 = uVar6;
          }
        }
        uVar20 = local_d6._2_4_;
        if (-1 < (short)local_e0._8_2_) {
          uVar20 = (int)(short)local_e0._8_2_ >> 5;
        }
        pUVar18 = L";%";
        iVar7 = UnicodeString::indexOf((UnicodeString *)local_e0,L";%",0,2,uVar19,uVar20 - uVar19);
        if (iVar7 == -1) {
          uVar19 = local_d6._2_4_;
          if (-1 < (short)local_e0._8_2_) {
            uVar19 = (int)(short)local_e0._8_2_ >> 5;
          }
          iVar7 = uVar19 - 1;
        }
        iVar8 = u_strlen_63(L"%%lenient-parse:");
        lVar21 = (long)(int)(iVar8 + uVar6);
        while( true ) {
          uVar19 = local_d6._2_4_;
          if (-1 < (short)local_e0._8_2_) {
            uVar19 = (int)(short)local_e0._8_2_ >> 5;
          }
          uVar20 = 0xffff;
          srcStart = (uint)lVar21;
          if (srcStart < uVar19) {
            pcVar16 = local_d6;
            if (((int)(short)local_e0._8_2_ & 2U) == 0) {
              pcVar16 = (char16_t *)local_d6._14_8_;
            }
            uVar20 = (uint)(ushort)pcVar16[lVar21];
          }
          UVar5 = PatternProps::isWhiteSpace(uVar20);
          if (UVar5 == '\0') break;
          lVar21 = lVar21 + 1;
        }
        pUVar11 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar18);
        if (pUVar11 == (UnicodeString *)0x0) {
          pUVar11 = (UnicodeString *)0x0;
        }
        else {
          (pUVar11->super_Replaceable).super_UObject._vptr_UObject =
               (_func_int **)&PTR__UnicodeString_003b5258;
          (pUVar11->fUnion).fStackFields.fLengthAndFlags = 2;
        }
        this->lenientParseRules = pUVar11;
        if (pUVar11 == (UnicodeString *)0x0) {
          *in_R8 = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          UnicodeString::unBogus(pUVar11);
          sVar1 = (pUVar11->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar8 = (pUVar11->fUnion).fFields.fLength;
          }
          else {
            iVar8 = (int)sVar1 >> 5;
          }
          UnicodeString::doReplace
                    (pUVar11,0,iVar8,(UnicodeString *)local_e0,srcStart,iVar7 - srcStart);
          iVar7 = (iVar7 - uVar6) + 1;
          if (((int)uVar6 < 1) && (iVar7 == 0x7fffffff)) {
            uVar15 = local_e0._8_2_ & 0x1e;
            uVar4 = local_e0._8_2_ & 1;
            local_e0._8_2_ = 2;
            if (uVar4 == 0) {
              local_e0._8_2_ = uVar15;
            }
          }
          else {
            UnicodeString::doReplace((UnicodeString *)local_e0,uVar6,iVar7,(UChar *)0x0,0,0);
          }
        }
        if (pUVar11 == (UnicodeString *)0x0) goto LAB_002158b3;
      }
      else {
        uVar19 = local_d6._2_4_;
        if (-1 < (short)local_e0._8_2_) {
          uVar19 = (int)(short)local_e0._8_2_ >> 5;
        }
        if (uVar6 - 1 < uVar19) {
          pcVar16 = (char16_t *)local_d6._14_8_;
          if (((int)(short)local_e0._8_2_ & 2U) != 0) {
            pcVar16 = local_d6;
          }
          if (pcVar16[(int)(uVar6 - 1)] == L';') goto LAB_002152a4;
        }
      }
    }
    this->numRuleSets = 0;
    uVar6 = local_d6._2_4_;
    if (-1 < (short)local_e0._8_2_) {
      uVar6 = (int)(short)local_e0._8_2_ >> 5;
    }
    uVar19 = (int)uVar6 >> 0x1f & uVar6;
    pUVar18 = L";%";
    iVar7 = UnicodeString::indexOf((UnicodeString *)local_e0,L";%",0,2,uVar19,uVar6 - uVar19);
    while( true ) {
      iVar2 = this->numRuleSets;
      this->numRuleSets = iVar2 + 1;
      if (iVar7 == -1) break;
      uVar6 = 0;
      if (-2 < iVar7) {
        uVar19 = local_d6._2_4_;
        if (-1 < (short)local_e0._8_2_) {
          uVar19 = (int)(short)local_e0._8_2_ >> 5;
        }
        uVar6 = iVar7 + 1U;
        if ((int)uVar19 < (int)(iVar7 + 1U)) {
          uVar6 = uVar19;
        }
      }
      uVar19 = local_d6._2_4_;
      if (-1 < (short)local_e0._8_2_) {
        uVar19 = (int)(short)local_e0._8_2_ >> 5;
      }
      pUVar18 = L";%";
      iVar7 = UnicodeString::indexOf((UnicodeString *)local_e0,L";%",0,2,uVar6,uVar19 - uVar6);
    }
    ppNVar12 = (NFRuleSet **)uprv_malloc_63((long)iVar2 * 8 + 0x10);
    this->fRuleSets = ppNVar12;
    if (ppNVar12 != (NFRuleSet **)0x0) {
      uVar6 = this->numRuleSets;
      lVar21 = (long)(int)uVar6;
      if (-1 < lVar21) {
        lVar17 = 0;
        do {
          pUVar18 = (UChar *)this->fRuleSets;
          *(NFRuleSet **)((long)pUVar18 + lVar17 * 8) = (NFRuleSet *)0x0;
          lVar17 = lVar17 + 1;
        } while ((ulong)uVar6 + 1 != lVar17);
      }
      if (uVar6 == 0) {
        local_e4 = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else {
        this_01 = (UMemory *)0xffffffffffffffff;
        if (-1 < (int)uVar6) {
          this_01 = (UMemory *)(lVar21 * 0x40 + 8);
        }
        plVar13 = (long *)UMemory::operator_new__(this_01,(size_t)pUVar18);
        if (plVar13 == (long *)0x0) {
          pUVar11 = (UnicodeString *)0x0;
        }
        else {
          *plVar13 = lVar21;
          pUVar11 = (UnicodeString *)(plVar13 + 1);
          lVar17 = 0;
          do {
            *(undefined ***)((long)plVar13 + lVar17 + 8) = &PTR__UnicodeString_003b5258;
            *(undefined2 *)((long)plVar13 + lVar17 + 0x10) = 2;
            lVar17 = lVar17 + 0x40;
          } while (lVar21 * 0x40 != lVar17);
        }
        this->ruleSetDescriptions = pUVar11;
        if (pUVar11 != (UnicodeString *)0x0) {
          local_f0 = 0;
          iVar8 = UnicodeString::indexOf((UnicodeString *)local_e0,L";%",2,0);
          uVar6 = 0;
          if (iVar8 != -1) {
            lVar21 = 0;
            local_f0 = 0;
            local_a0 = in_R8;
            uVar19 = 0;
            do {
              pUVar3 = this->ruleSetDescriptions;
              pUVar11 = (UnicodeString *)
                        ((long)&(pUVar3->super_Replaceable).super_UObject._vptr_UObject + lVar21);
              UnicodeString::unBogus(pUVar11);
              sVar1 = *(short *)((long)&pUVar3->fUnion + lVar21);
              if (sVar1 < 0) {
                length = *(int32_t *)((long)&pUVar3->fUnion + lVar21 + 4);
              }
              else {
                length = (int)sVar1 >> 5;
              }
              uVar6 = iVar8 + 1;
              size = 0;
              UnicodeString::doReplace
                        (pUVar11,0,length,(UnicodeString *)local_e0,uVar19,uVar6 - uVar19);
              pNVar14 = (NFRuleSet *)UMemory::operator_new((UMemory *)0xa8,size);
              if (pNVar14 == (NFRuleSet *)0x0) {
                pNVar14 = (NFRuleSet *)0x0;
              }
              else {
                NFRuleSet::NFRuleSet
                          (pNVar14,this,this->ruleSetDescriptions,(int32_t)local_f0,local_a0);
              }
              this->fRuleSets[local_f0] = pNVar14;
              in_R8 = local_a0;
              if (this->fRuleSets[local_f0] == (NFRuleSet *)0x0) goto LAB_002158ab;
              uVar19 = 0;
              if (-2 < iVar8) {
                uVar19 = local_d6._2_4_;
                if (-1 < (short)local_e0._8_2_) {
                  uVar19 = (int)(short)local_e0._8_2_ >> 5;
                }
                if ((int)uVar6 <= (int)uVar19) {
                  uVar19 = uVar6;
                }
              }
              uVar20 = local_d6._2_4_;
              if (-1 < (short)local_e0._8_2_) {
                uVar20 = (int)(short)local_e0._8_2_ >> 5;
              }
              iVar8 = UnicodeString::indexOf
                                ((UnicodeString *)local_e0,L";%",0,2,uVar19,uVar20 - uVar19);
              local_f0 = local_f0 + 1;
              lVar21 = lVar21 + 0x40;
              in_R8 = local_a0;
              uVar19 = uVar6;
            } while (iVar8 != -1);
          }
          uVar22 = local_f0 & 0xffffffff;
          if (-1 < (short)local_e0._8_2_) {
            local_d6._2_4_ = (int)(short)local_e0._8_2_ >> 5;
          }
          pUVar11 = (UnicodeString *)local_e0;
          UnicodeString::setTo
                    (this->ruleSetDescriptions + uVar22,pUVar11,uVar6,local_d6._2_4_ - uVar6);
          pNVar14 = (NFRuleSet *)UMemory::operator_new((UMemory *)0xa8,(size_t)pUVar11);
          if (pNVar14 == (NFRuleSet *)0x0) {
            pNVar14 = (NFRuleSet *)0x0;
          }
          else {
            NFRuleSet::NFRuleSet(pNVar14,this,this->ruleSetDescriptions,(int32_t)local_f0,in_R8);
          }
          this->fRuleSets[uVar22] = pNVar14;
          if (this->fRuleSets[uVar22] != (NFRuleSet *)0x0) {
            initDefaultRuleSet(this);
            if (0 < this->numRuleSets) {
              lVar21 = 0;
              lVar17 = 0;
              do {
                NFRuleSet::parseRules
                          (this->fRuleSets[lVar17],
                           (UnicodeString *)
                           ((long)&(this->ruleSetDescriptions->super_Replaceable).super_UObject.
                                   _vptr_UObject + lVar21),in_R8);
                lVar17 = lVar17 + 1;
                lVar21 = lVar21 + 0x40;
              } while (lVar17 < this->numRuleSets);
            }
            pUVar11 = local_88;
            if (local_98 != (LocalizationInfo *)0x0) {
              for (uVar6 = 0; iVar7 = (*local_98->_vptr_LocalizationInfo[3])(), (int)uVar6 < iVar7;
                  uVar6 = uVar6 + 1) {
                iVar7 = (*local_98->_vptr_LocalizationInfo[4])(local_98,(ulong)uVar6);
                local_90.p_ = (char16_t *)CONCAT44(extraout_var,iVar7);
                UnicodeString::UnicodeString(&local_70,'\x01',&local_90,-1);
                local_80 = local_90.p_;
                pNVar14 = findRuleSet(this,&local_70,in_R8);
                if (pNVar14 == (NFRuleSet *)0x0) {
                  UnicodeString::~UnicodeString(&local_70);
                  break;
                }
                if (uVar6 == 0) {
                  this->defaultRuleSet = pNVar14;
                }
                UnicodeString::~UnicodeString(&local_70);
              }
            }
            UnicodeString::operator=(&this->originalDescription,pUVar11);
            goto LAB_002158b3;
          }
        }
      }
    }
  }
LAB_002158ab:
  *in_R8 = local_e4;
LAB_002158b3:
  UnicodeString::~UnicodeString((UnicodeString *)local_e0);
  return extraout_EAX;
}

Assistant:

void
RuleBasedNumberFormat::init(const UnicodeString& rules, LocalizationInfo* localizationInfos,
                            UParseError& pErr, UErrorCode& status)
{
    // TODO: implement UParseError
    uprv_memset(&pErr, 0, sizeof(UParseError));
    // Note: this can leave ruleSets == NULL, so remaining code should check
    if (U_FAILURE(status)) {
        return;
    }

    initializeDecimalFormatSymbols(status);
    initializeDefaultInfinityRule(status);
    initializeDefaultNaNRule(status);
    if (U_FAILURE(status)) {
        return;
    }

    this->localizations = localizationInfos == NULL ? NULL : localizationInfos->ref();

    UnicodeString description(rules);
    if (!description.length()) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    // start by stripping the trailing whitespace from all the rules
    // (this is all the whitespace follwing each semicolon in the
    // description).  This allows us to look for rule-set boundaries
    // by searching for ";%" without having to worry about whitespace
    // between the ; and the %
    stripWhitespace(description);

    // check to see if there's a set of lenient-parse rules.  If there
    // is, pull them out into our temporary holding place for them,
    // and delete them from the description before the real desciption-
    // parsing code sees them
    int32_t lp = description.indexOf(gLenientParse, -1, 0);
    if (lp != -1) {
        // we've got to make sure we're not in the middle of a rule
        // (where "%%lenient-parse" would actually get treated as
        // rule text)
        if (lp == 0 || description.charAt(lp - 1) == gSemiColon) {
            // locate the beginning and end of the actual collation
            // rules (there may be whitespace between the name and
            // the first token in the description)
            int lpEnd = description.indexOf(gSemiPercent, 2, lp);

            if (lpEnd == -1) {
                lpEnd = description.length() - 1;
            }
            int lpStart = lp + u_strlen(gLenientParse);
            while (PatternProps::isWhiteSpace(description.charAt(lpStart))) {
                ++lpStart;
            }

            // copy out the lenient-parse rules and delete them
            // from the description
            lenientParseRules = new UnicodeString();
            /* test for NULL */
            if (lenientParseRules == nullptr) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            lenientParseRules->setTo(description, lpStart, lpEnd - lpStart);

            description.remove(lp, lpEnd + 1 - lp);
        }
    }

    // pre-flight parsing the description and count the number of
    // rule sets (";%" marks the end of one rule set and the beginning
    // of the next)
    numRuleSets = 0;
    for (int32_t p = description.indexOf(gSemiPercent, 2, 0); p != -1; p = description.indexOf(gSemiPercent, 2, p)) {
        ++numRuleSets;
        ++p;
    }
    ++numRuleSets;

    // our rule list is an array of the appropriate size
    fRuleSets = (NFRuleSet **)uprv_malloc((numRuleSets + 1) * sizeof(NFRuleSet *));
    /* test for NULL */
    if (fRuleSets == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    for (int i = 0; i <= numRuleSets; ++i) {
        fRuleSets[i] = NULL;
    }

    // divide up the descriptions into individual rule-set descriptions
    // and store them in a temporary array.  At each step, we also
    // new up a rule set, but all this does is initialize its name
    // and remove it from its description.  We can't actually parse
    // the rest of the descriptions and finish initializing everything
    // because we have to know the names and locations of all the rule
    // sets before we can actually set everything up
    if(!numRuleSets) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    ruleSetDescriptions = new UnicodeString[numRuleSets];
    if (ruleSetDescriptions == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    {
        int curRuleSet = 0;
        int32_t start = 0;
        for (int32_t p = description.indexOf(gSemiPercent, 2, 0); p != -1; p = description.indexOf(gSemiPercent, 2, start)) {
            ruleSetDescriptions[curRuleSet].setTo(description, start, p + 1 - start);
            fRuleSets[curRuleSet] = new NFRuleSet(this, ruleSetDescriptions, curRuleSet, status);
            if (fRuleSets[curRuleSet] == nullptr) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            ++curRuleSet;
            start = p + 1;
        }
        ruleSetDescriptions[curRuleSet].setTo(description, start, description.length() - start);
        fRuleSets[curRuleSet] = new NFRuleSet(this, ruleSetDescriptions, curRuleSet, status);
        if (fRuleSets[curRuleSet] == nullptr) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
    }

    // now we can take note of the formatter's default rule set, which
    // is the last public rule set in the description (it's the last
    // rather than the first so that a user can create a new formatter
    // from an existing formatter and change its default behavior just
    // by appending more rule sets to the end)

    // {dlf} Initialization of a fraction rule set requires the default rule
    // set to be known.  For purposes of initialization, this is always the 
    // last public rule set, no matter what the localization data says.
    initDefaultRuleSet();

    // finally, we can go back through the temporary descriptions
    // list and finish setting up the substructure (and we throw
    // away the temporary descriptions as we go)
    {
        for (int i = 0; i < numRuleSets; i++) {
            fRuleSets[i]->parseRules(ruleSetDescriptions[i], status);
        }
    }

    // Now that the rules are initialized, the 'real' default rule
    // set can be adjusted by the localization data.

    // The C code keeps the localization array as is, rather than building
    // a separate array of the public rule set names, so we have less work
    // to do here-- but we still need to check the names.
    
    if (localizationInfos) {
        // confirm the names, if any aren't in the rules, that's an error
        // it is ok if the rules contain public rule sets that are not in this list
        for (int32_t i = 0; i < localizationInfos->getNumberOfRuleSets(); ++i) {
            UnicodeString name(TRUE, localizationInfos->getRuleSetName(i), -1);
            NFRuleSet* rs = findRuleSet(name, status);
            if (rs == NULL) {
                break; // error
            }
            if (i == 0) {
                defaultRuleSet = rs;
            }
        }
    } else {
        defaultRuleSet = getDefaultRuleSet();
    }
    originalDescription = rules;
}